

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# presagearchive.c
# Opt level: O0

PresageArchive * PresageArchive_NewFromFiles(char *path1,char *path2,LPStatus *status)

{
  uint32_t uVar1;
  int iVar2;
  PresageArchiveMember **ppPVar3;
  PresageArchiveMember *member_00;
  long lVar4;
  char local_a8 [8];
  PresageArchiveMemberName name;
  long rewind_amt;
  uint32_t abs_offset;
  int i_1;
  FILE *name_finder_fp;
  uint32_t local_78;
  uint32_t size;
  uint32_t rid;
  PresageArchiveMemberFiletype filetype;
  uint32_t offset;
  uint16_t internal_id;
  PresageArchiveMember *member;
  int local_58;
  LPStatus new_member_status;
  int i;
  uint16_t actual_n_entries;
  uint8_t magic;
  FILE *fp;
  PRX *prx;
  PRDPRS *prdprs;
  PresageArchive *pPStack_30;
  LPStatus new_archive_status;
  PresageArchive *archive;
  LPStatus *status_local;
  char *path2_local;
  char *path1_local;
  
  archive = (PresageArchive *)status;
  status_local = (LPStatus *)path2;
  path2_local = path1;
  pPStack_30 = (PresageArchive *)calloc(1,0x20);
  if (pPStack_30 == (PresageArchive *)0x0) {
    archive->kind = PRESAGE_ARCHIVE_KIND_PRX;
  }
  else {
    if ((path2_local == (char *)0x0) || (status_local == (LPStatus *)0x0)) {
      pPStack_30->kind = PRESAGE_ARCHIVE_KIND_PRX;
    }
    else {
      pPStack_30->kind = PRESAGE_ARCHIVE_KIND_PRDPRS;
    }
    if (pPStack_30->kind == PRESAGE_ARCHIVE_KIND_PRDPRS) {
      prx = (PRX *)PRDPRS_New(path2_local,(char *)status_local,(LPStatus *)((long)&prdprs + 4));
      if (prdprs._4_4_ != PRESAGE_ARCHIVE_KIND_PRDPRS) {
        archive->kind = prdprs._4_4_;
        goto LAB_00102ab1;
      }
      (pPStack_30->archive).prx = prx;
    }
    else if (pPStack_30->kind == PRESAGE_ARCHIVE_KIND_PRX) {
      fp = (FILE *)PRX_New(path2_local,(LPStatus *)((long)&prdprs + 4));
      if (prdprs._4_4_ != PRESAGE_ARCHIVE_KIND_PRDPRS) {
        archive->kind = prdprs._4_4_;
        goto LAB_00102ab1;
      }
      (pPStack_30->archive).prx = (PRX *)fp;
    }
    if (pPStack_30->kind == PRESAGE_ARCHIVE_KIND_PRDPRS) {
      _i = (FILE *)((pPStack_30->archive).prdprs)->header_fp;
    }
    else if (pPStack_30->kind == PRESAGE_ARCHIVE_KIND_PRX) {
      _i = (FILE *)((pPStack_30->archive).prdprs)->header_fp;
    }
    ReadUint8((FILE *)_i,1,(byte *)((long)&new_member_status + 3));
    if (new_member_status._3_1_ == 1) {
      fseek(_i,0x89,1);
      ReadUint16LE((FILE *)_i,1,(uint16_t *)&new_member_status);
      ReadUint16LE((FILE *)_i,1,&pPStack_30->n_entries);
      fseek(_i,2,1);
      ppPVar3 = (PresageArchiveMember **)calloc((ulong)pPStack_30->n_entries,0x30);
      pPStack_30->members = ppPVar3;
      fseek(_i,0x18,1);
      local_58 = 0;
      while( true ) {
        if ((int)(uint)pPStack_30->n_entries <= local_58) {
          fseek(_i,(long)(int)((uint)(ushort)(undefined2)new_member_status -
                              (uint)pPStack_30->n_entries) * 0x18,1);
          if (pPStack_30->kind == PRESAGE_ARCHIVE_KIND_PRX) {
            lVar4 = ftell(_i);
            pPStack_30->data_offset_start = (uint32_t)lVar4;
          }
          _abs_offset = (FILE *)0x0;
          if (pPStack_30->kind == PRESAGE_ARCHIVE_KIND_PRDPRS) {
            _abs_offset = (FILE *)((pPStack_30->archive).prdprs)->data_fp;
          }
          else if (pPStack_30->kind == PRESAGE_ARCHIVE_KIND_PRX) {
            _abs_offset = (FILE *)((pPStack_30->archive).prdprs)->header_fp;
          }
          for (rewind_amt._4_4_ = 0; rewind_amt._4_4_ < (int)(uint)pPStack_30->n_entries;
              rewind_amt._4_4_ = rewind_amt._4_4_ + 1) {
            uVar1 = PresageArchive_AbsoluteOffsetForMemberAtIndex(pPStack_30,rewind_amt._4_4_);
            fseek(_abs_offset,(ulong)uVar1,0);
            iVar2 = 6;
            if (pPStack_30->kind == PRESAGE_ARCHIVE_KIND_PRDPRS) {
              iVar2 = 5;
            }
            name._8_8_ = (long)iVar2 + 0x10;
            fseek(_abs_offset,-name._8_8_,1);
            ReadChar((FILE *)_abs_offset,0x10,local_a8);
            PresageArchiveMember_SetName(pPStack_30->members[rewind_amt._4_4_],local_a8);
          }
          archive->kind = PRESAGE_ARCHIVE_KIND_PRDPRS;
          return pPStack_30;
        }
        member_00 = PresageArchiveMember_New((LPStatus *)((long)&member + 4));
        if (member._4_4_ != PRESAGE_ARCHIVE_KIND_PRDPRS) break;
        ReadUint16LE((FILE *)_i,1,(uint16_t *)(filetype + 2));
        if (filetype._2_2_ == 0) {
          PresageArchiveMember_SetInternalId(member_00,pPStack_30->n_entries + 1);
        }
        else {
          PresageArchiveMember_SetInternalId(member_00,filetype._2_2_);
        }
        fseek(_i,6,1);
        ReadUint32LE((FILE *)_i,1,&rid);
        PresageArchiveMember_SetOffset(member_00,rid);
        ReadChar((FILE *)_i,4,(char *)&size);
        PresageArchiveMember_SetFiletype(member_00,(char *)&size);
        ReadUint32LE((FILE *)_i,1,&local_78);
        PresageArchiveMember_SetResourceId(member_00,local_78);
        ReadUint32LE((FILE *)_i,1,(uint32_t *)((long)&name_finder_fp + 4));
        PresageArchiveMember_SetSize(member_00,name_finder_fp._4_4_);
        pPStack_30->members[local_58] = member_00;
        local_58 = local_58 + 1;
      }
      archive->kind = member._4_4_;
    }
    else {
      archive->kind = 3;
    }
  }
LAB_00102ab1:
  PresageArchive_Close(pPStack_30);
  return (PresageArchive *)0x0;
}

Assistant:

PresageArchive *
PresageArchive_NewFromFiles(const char *path1, const char *path2, LPStatus *status)
{
	PresageArchive *archive = calloc(1, sizeof(PresageArchive));

	if (!archive) {
		*status = LUNAPURPURA_ERROR;
		goto fail;
	}

	if (path1 && path2) {
		archive->kind = PRESAGE_ARCHIVE_KIND_PRDPRS;
	} else {
		archive->kind = PRESAGE_ARCHIVE_KIND_PRX;
	}

	LPStatus new_archive_status;

	switch (archive->kind) {
	case PRESAGE_ARCHIVE_KIND_PRDPRS:
		{
			PRDPRS *prdprs = PRDPRS_New(path1, path2, &new_archive_status);
			if (new_archive_status != LUNAPURPURA_OK) {
				*status = new_archive_status;
				goto fail;
			}
			archive->archive.prdprs = prdprs;
		}
		break;
	case PRESAGE_ARCHIVE_KIND_PRX:
		{
			PRX *prx = PRX_New(path1, &new_archive_status);
			if (new_archive_status != LUNAPURPURA_OK) {
				*status = new_archive_status;
				goto fail;
			}
			archive->archive.prx = prx;
		}
		break;
	}

	/*
	 * At this stage in the process, we are only concerned about the members'
	 * metadata, so, obtain the appropriate file pointer for that task.
	 */
	FILE *fp;
	switch (archive->kind) {
		case PRESAGE_ARCHIVE_KIND_PRDPRS: fp = archive->archive.prdprs->header_fp; break;
		case PRESAGE_ARCHIVE_KIND_PRX: fp = archive->archive.prx->fp; break;
	}

	uint8_t magic;
	ReadUint8(fp, 1, &magic);
	if (magic != PRX_MAGIC) {
		*status = LUNAPURPURA_BADMAGIC;
		goto fail;
	}

	/* 128 + 10 - 1, I guess -- all zeroes */
	fseek(fp, 137L, SEEK_CUR);

	/*
	 * This is the number of entries _including_ dummy ones, which may be
	 * present at the start and/or end of the archive's table of contents.
	 */
	uint16_t actual_n_entries;
	ReadUint16LE(fp, 1, &actual_n_entries);

	/* This is the real count of entries we ultimately care about. */
	ReadUint16LE(fp, 1, &archive->n_entries);

	fseek(fp, 2L, SEEK_CUR); /* Ignore */

	archive->members = calloc(archive->n_entries, sizeof(PresageArchiveMember));

	/*
	 * Purposefully skip over the zeroeth entry (which has internal_id of 1),
	 * it's always a "dummy" entry which serves little purpose.
	 */
	fseek(fp, 24L, SEEK_CUR);

	/*
	 * OK now we *finally* can access the individual archive members.
	 */
	for (int i = 0; i < archive->n_entries; i++) {
		LPStatus new_member_status;
		PresageArchiveMember *member = PresageArchiveMember_New(&new_member_status);

		if (new_member_status != LUNAPURPURA_OK) {
			*status = new_member_status;
			goto fail;
		}

		/*
		 * The last internal_id is always stored as '0' rather than what you'd
		 * expect. Anthony Kozar suspects this is to merely signify the end of the
		 * list, since we already know how many members there are by now.
		 */
		uint16_t internal_id;
		ReadUint16LE(fp, 1, &internal_id);
		if (internal_id == 0) {
			PresageArchiveMember_SetInternalId(member, archive->n_entries+1);
		} else {
			PresageArchiveMember_SetInternalId(member, internal_id);
		}

		fseek(fp, 6L, SEEK_CUR);

		uint32_t offset;
		ReadUint32LE(fp, 1, &offset);
		PresageArchiveMember_SetOffset(member, offset);

		PresageArchiveMemberFiletype filetype;
		ReadChar(fp, sizeof(PresageArchiveMemberFiletype), filetype);
		PresageArchiveMember_SetFiletype(member, filetype);

		uint32_t rid;
		ReadUint32LE(fp, 1, &rid);
		PresageArchiveMember_SetResourceId(member, rid);

		uint32_t size;
		ReadUint32LE(fp, 1, &size);
		PresageArchiveMember_SetSize(member, size);

		archive->members[i] = member;
	}

	/*
	 * Account for the dummy entries at the end of the table of contents, if
	 * necessary.
	 */
	fseek(fp, 24L*(actual_n_entries - archive->n_entries), SEEK_CUR);

	/*
	 * In PRXes, the "offset" field for each member does NOT indicate an absolute
	 * offset. It's actually an offset from the position of the file we're
	 * currently at right now. So let's keep track of it.
	 */
	if (archive->kind == PRESAGE_ARCHIVE_KIND_PRX) {
		archive->data_offset_start = ftell(fp);
	}

	/*
	 * OK now let's figure out the individual member names. We start with the
	 * 1st member (not the 0th member) because remember we actually can't
	 * obtain information about the "dummy" entry at the beginning.
	 *
	 * Also, the offset brings us to the start of the data, but that skips
	 * past the filename!  So that's why we rewind a little.
	 *
	 * This is a little tricky because, in PRD/PRS pairs, the member names are
	 * NOT stored in the header. So we have to bring the other file pointer into
	 * the picture now.
	 */
	FILE *name_finder_fp = NULL;

	switch (archive->kind) {
		case PRESAGE_ARCHIVE_KIND_PRDPRS: name_finder_fp = archive->archive.prdprs->data_fp; break;
		case PRESAGE_ARCHIVE_KIND_PRX: name_finder_fp = archive->archive.prx->fp; break;
	}

	for (int i = 0; i < archive->n_entries; i++) {
		uint32_t abs_offset = PresageArchive_AbsoluteOffsetForMemberAtIndex(archive, i);
		fseek(name_finder_fp, abs_offset, SEEK_SET);

		/* 
		 * Rewind to get the filename. Purposefully avoid an extra underscore in
		 * PRD/PRS members.
		 */
		long rewind_amt = PRESAGEARCHIVEMEMBER_NAME_LEN;
		rewind_amt += (archive->kind == PRESAGE_ARCHIVE_KIND_PRDPRS) ? 5 : 6;
		fseek(name_finder_fp, -rewind_amt, SEEK_CUR); 

		PresageArchiveMemberName name;
		ReadChar(name_finder_fp, sizeof(PresageArchiveMemberName), name);
		PresageArchiveMember_SetName(archive->members[i], name);
	}

	*status = LUNAPURPURA_OK;
	return archive;

fail:
	PresageArchive_Close(archive);
	return NULL;
}